

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O1

TemplateDictionary * __thiscall
ctemplate::TemplateDictionary::AddSectionDictionary
          (TemplateDictionary *this,TemplateString section_name)

{
  UnsafeArena *pUVar1;
  small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
  *psVar2;
  BaseArena *this_00;
  TemplateDictionary *pTVar3;
  iterator __position;
  SectionDict *pSVar4;
  TemplateId v;
  vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>
  *this_01;
  char *pcVar5;
  data_type *ppvVar6;
  TemplateDictionary *this_02;
  char *in_R9;
  string newname;
  TemplateDictionary *local_80;
  TemplateString local_78;
  undefined1 local_50 [32];
  
  if (this->section_dict_ == (SectionDict *)0x0) {
    pSVar4 = (SectionDict *)BaseArena::GetMemory(&this->arena_->super_BaseArena,0x50,8);
    pUVar1 = this->arena_;
    pSVar4->size_ = 0;
    (pSVar4->functor_).arena_ = pUVar1;
    this->section_dict_ = pSVar4;
  }
  psVar2 = this->section_dict_;
  v = TemplateString::GetGlobalId(&section_name);
  this_01 = (vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>
             *)find_ptr2<ctemplate::small_map<std::map<unsigned_long,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>,unsigned_long>
                         (psVar2,v);
  if (this_01 ==
      (vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>
       *)0x0) {
    this_01 = (vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>
               *)BaseArena::GetMemory(&this->arena_->super_BaseArena,0x20,8);
    *(UnsafeArena **)this_01 = this->arena_;
    *(undefined8 *)(this_01 + 8) = 0;
    *(pointer *)(this_01 + 0x10) = (pointer)0x0;
    *(pointer *)(this_01 + 0x18) = (pointer)0x0;
    std::
    vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>
    ::reserve((vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>
               *)this_01,8);
    psVar2 = this->section_dict_;
    local_78.is_immutable_ = section_name.is_immutable_;
    local_78._17_7_ = section_name._17_7_;
    local_78.id_ = section_name.id_;
    local_78.ptr_ = section_name.ptr_;
    local_78.length_ = section_name.length_;
    pcVar5 = (char *)TemplateString::GetGlobalId(&local_78);
    local_50._0_8_ = pcVar5;
    ppvVar6 = small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
              ::operator[](psVar2,(key_type *)local_50);
    *ppvVar6 = (data_type)this_01;
    if (local_78.id_ == 0) {
      local_50._0_8_ = local_78.ptr_;
      local_50._8_8_ = local_78.length_;
      local_50[0x10] = local_78.is_immutable_;
      local_50._24_8_ = pcVar5;
      TemplateString::AddToGlobalIdToNameMap((TemplateString *)local_50);
    }
  }
  CreateSubdictName_abi_cxx11_
            ((string *)local_50,(TemplateDictionary *)&this->name_,&section_name,
             (TemplateString *)((*(long *)(this_01 + 0x10) - *(long *)(this_01 + 8) >> 3) + 1),
             0x132a9f,in_R9);
  local_78.ptr_ = (char *)local_50._0_8_;
  local_78.length_ = local_50._8_8_;
  local_78._16_8_ = local_78._16_8_ & 0xffffffffffffff00;
  local_78.id_ = 0;
  this_00 = &this->arena_->super_BaseArena;
  pTVar3 = this->template_global_dict_owner_;
  this_02 = (TemplateDictionary *)BaseArena::GetMemory(this_00,0x70,8);
  TemplateDictionary(this_02,&local_78,(UnsafeArena *)this_00,this,pTVar3);
  __position._M_current = *(TemplateDictionary ***)(this_01 + 0x10);
  local_80 = this_02;
  if (__position._M_current == *(TemplateDictionary ***)(this_01 + 0x18)) {
    std::
    vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>
    ::_M_realloc_insert<ctemplate::TemplateDictionary*const&>(this_01,__position,&local_80);
  }
  else {
    *__position._M_current = this_02;
    *(long *)(this_01 + 0x10) = *(long *)(this_01 + 0x10) + 8;
  }
  pTVar3 = local_80;
  if ((undefined1 *)local_50._0_8_ != local_50 + 0x10) {
    operator_delete((void *)local_50._0_8_);
  }
  return pTVar3;
}

Assistant:

TemplateDictionary* TemplateDictionary::AddSectionDictionary(
    const TemplateString section_name) {
  LazilyCreateDict(&section_dict_);
  DictVector* dicts = find_ptr2(*section_dict_, section_name.GetGlobalId());
  if (!dicts) {
    dicts = CreateDictVector();
    // Since most lists will remain under 8 or 16 entries but will frequently
    // be more than four, this prevents copying from 1->2->4->8.
    dicts->reserve(8);
    HashInsert(section_dict_, section_name, dicts);
  }
  assert(dicts != NULL);
  const string newname(CreateSubdictName(name_, section_name,
                                         dicts->size() + 1, ""));
  TemplateDictionary* retval = CreateTemplateSubdict(
      newname, arena_, this, template_global_dict_owner_);
  dicts->push_back(retval);
  return retval;
}